

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall llvm::detail::IEEEFloat::next(IEEEFloat *this,bool nextDown)

{
  bool Negative;
  bool bVar1;
  uint uVar2;
  integerPart *piVar3;
  bool local_69;
  bool local_59;
  integerPart *Parts_1;
  bool WillCrossBinadeBoundary_1;
  integerPart *Parts;
  opStatus local_18;
  bool WillCrossBinadeBoundary;
  opStatus result;
  bool nextDown_local;
  IEEEFloat *this_local;
  
  if (nextDown) {
    changeSign(this);
  }
  local_18 = opOK;
  switch(this->field_0x12 & 7) {
  case 0:
    bVar1 = isNegative(this);
    if (bVar1) {
      makeLargest(this,true);
    }
    break;
  case 1:
    bVar1 = isSignaling(this);
    if (bVar1) {
      Negative = isNegative(this);
      makeNaN(this,false,Negative,(APInt *)0x0);
    }
    local_18 = (opStatus)bVar1;
    break;
  case 2:
    bVar1 = isSmallest(this);
    if ((bVar1) && (bVar1 = isNegative(this), bVar1)) {
      piVar3 = significandParts(this);
      uVar2 = partCount(this);
      APInt::tcSet(piVar3,0,uVar2);
      this->field_0x12 = this->field_0x12 & 0xf8 | 3;
      this->exponent = 0;
    }
    else {
      bVar1 = isLargest(this);
      if ((!bVar1) || (bVar1 = isNegative(this), bVar1)) {
        bVar1 = isNegative(this);
        if (bVar1) {
          local_59 = false;
          if (this->exponent != this->semantics->minExponent) {
            local_59 = isSignificandAllZeros(this);
          }
          piVar3 = significandParts(this);
          uVar2 = partCount(this);
          APInt::tcDecrement(piVar3,uVar2);
          if (local_59 != false) {
            APInt::tcSetBit(piVar3,this->semantics->precision - 1);
            this->exponent = this->exponent + -1;
          }
        }
        else {
          bVar1 = isDenormal(this);
          local_69 = false;
          if (!bVar1) {
            local_69 = isSignificandAllOnes(this);
          }
          if (local_69 == false) {
            incrementSignificand(this);
          }
          else {
            piVar3 = significandParts(this);
            uVar2 = partCount(this);
            APInt::tcSet(piVar3,0,uVar2);
            APInt::tcSetBit(piVar3,this->semantics->precision - 1);
            if (this->exponent == this->semantics->maxExponent) {
              __assert_fail("exponent != semantics->maxExponent && \"We can not increment an exponent beyond the maxExponent allowed\" \" by the given floating point semantics.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                            ,0xeac,"IEEEFloat::opStatus llvm::detail::IEEEFloat::next(bool)");
            }
            this->exponent = this->exponent + 1;
          }
        }
      }
      else {
        piVar3 = significandParts(this);
        uVar2 = partCount(this);
        APInt::tcSet(piVar3,0,uVar2);
        this->field_0x12 = this->field_0x12 & 0xf8;
        this->exponent = this->semantics->maxExponent + 1;
      }
    }
    break;
  case 3:
    makeSmallest(this,false);
  }
  if (nextDown) {
    changeSign(this);
  }
  return local_18;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::next(bool nextDown) {
  // If we are performing nextDown, swap sign so we have -x.
  if (nextDown)
    changeSign();

  // Compute nextUp(x)
  opStatus result = opOK;

  // Handle each float category separately.
  switch (category) {
  case fcInfinity:
    // nextUp(+inf) = +inf
    if (!isNegative())
      break;
    // nextUp(-inf) = -getLargest()
    makeLargest(true);
    break;
  case fcNaN:
    // IEEE-754R 2008 6.2 Par 2: nextUp(sNaN) = qNaN. Set Invalid flag.
    // IEEE-754R 2008 6.2: nextUp(qNaN) = qNaN. Must be identity so we do not
    //                     change the payload.
    if (isSignaling()) {
      result = opInvalidOp;
      // For consistency, propagate the sign of the sNaN to the qNaN.
      makeNaN(false, isNegative(), nullptr);
    }
    break;
  case fcZero:
    // nextUp(pm 0) = +getSmallest()
    makeSmallest(false);
    break;
  case fcNormal:
    // nextUp(-getSmallest()) = -0
    if (isSmallest() && isNegative()) {
      APInt::tcSet(significandParts(), 0, partCount());
      category = fcZero;
      exponent = 0;
      break;
    }

    // nextUp(getLargest()) == INFINITY
    if (isLargest() && !isNegative()) {
      APInt::tcSet(significandParts(), 0, partCount());
      category = fcInfinity;
      exponent = semantics->maxExponent + 1;
      break;
    }

    // nextUp(normal) == normal + inc.
    if (isNegative()) {
      // If we are negative, we need to decrement the significand.

      // We only cross a binade boundary that requires adjusting the exponent
      // if:
      //   1. exponent != semantics->minExponent. This implies we are not in the
      //   smallest binade or are dealing with denormals.
      //   2. Our significand excluding the integral bit is all zeros.
      bool WillCrossBinadeBoundary =
        exponent != semantics->minExponent && isSignificandAllZeros();

      // Decrement the significand.
      //
      // We always do this since:
      //   1. If we are dealing with a non-binade decrement, by definition we
      //   just decrement the significand.
      //   2. If we are dealing with a normal -> normal binade decrement, since
      //   we have an explicit integral bit the fact that all bits but the
      //   integral bit are zero implies that subtracting one will yield a
      //   significand with 0 integral bit and 1 in all other spots. Thus we
      //   must just adjust the exponent and set the integral bit to 1.
      //   3. If we are dealing with a normal -> denormal binade decrement,
      //   since we set the integral bit to 0 when we represent denormals, we
      //   just decrement the significand.
      integerPart *Parts = significandParts();
      APInt::tcDecrement(Parts, partCount());

      if (WillCrossBinadeBoundary) {
        // Our result is a normal number. Do the following:
        // 1. Set the integral bit to 1.
        // 2. Decrement the exponent.
        APInt::tcSetBit(Parts, semantics->precision - 1);
        exponent--;
      }
    } else {
      // If we are positive, we need to increment the significand.

      // We only cross a binade boundary that requires adjusting the exponent if
      // the input is not a denormal and all of said input's significand bits
      // are set. If all of said conditions are true: clear the significand, set
      // the integral bit to 1, and increment the exponent. If we have a
      // denormal always increment since moving denormals and the numbers in the
      // smallest normal binade have the same exponent in our representation.
      bool WillCrossBinadeBoundary = !isDenormal() && isSignificandAllOnes();

      if (WillCrossBinadeBoundary) {
        integerPart *Parts = significandParts();
        APInt::tcSet(Parts, 0, partCount());
        APInt::tcSetBit(Parts, semantics->precision - 1);
        assert(exponent != semantics->maxExponent &&
               "We can not increment an exponent beyond the maxExponent allowed"
               " by the given floating point semantics.");
        exponent++;
      } else {
        incrementSignificand();
      }
    }
    break;
  }

  // If we are performing nextDown, swap sign so we have -nextUp(-x)
  if (nextDown)
    changeSign();

  return result;
}